

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O0

void __thiscall
lzham::vector<lzham::lzcompressor::lzdecision>::clear(vector<lzham::lzcompressor::lzdecision> *this)

{
  long lVar1;
  void *extraout_RDX;
  lzdecision *in_RDI;
  uint in_stack_ffffffffffffffec;
  
  lVar1._0_4_ = in_RDI->m_pos;
  lVar1._4_4_ = in_RDI->m_len;
  if (lVar1 != 0) {
    scalar_type<lzham::lzcompressor::lzdecision>::destruct_array(in_RDI,in_stack_ffffffffffffffec);
    lzham::lzham_free(*(lzham **)&in_RDI[1].m_len,*(void **)in_RDI,extraout_RDX);
    in_RDI->m_pos = 0;
    in_RDI->m_len = 0;
    in_RDI->m_dist = 0;
    in_RDI[1].m_pos = 0;
  }
  return;
}

Assistant:

inline void clear()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            lzham_free(m_malloc_context, m_p);
            m_p = NULL;
            m_size = 0;
            m_capacity = 0;
         }
      }